

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O3

void __thiscall OpenMD::Electrostatic::calcForce(Electrostatic *this,InteractionData *idat)

{
  RealType *t;
  RealType *__s;
  pointer pEVar1;
  pointer pEVar2;
  undefined8 *puVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  pointer piVar9;
  pointer pEVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  RealType RVar15;
  RealType RVar16;
  RealType RVar17;
  RealType RVar18;
  undefined8 uVar19;
  bool bVar20;
  bool bVar21;
  undefined3 uVar22;
  int iVar23;
  char cVar24;
  uint i_4;
  Mat3x3d *pMVar25;
  double dVar26;
  Mat3x3d *pMVar27;
  char cVar28;
  uint i_2;
  undefined4 uVar29;
  long lVar30;
  uint i;
  byte bVar31;
  Mat3x3d *pMVar32;
  long lVar33;
  uint j_3;
  uint i_34;
  uint j_4;
  ulong uVar34;
  uint j_5;
  long lVar35;
  long lVar36;
  byte bVar37;
  double tmp;
  double tmp_1;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double tmp_7;
  double dVar43;
  double dVar44;
  double dVar45;
  Vector<double,_3U> result_4;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_8;
  Vector<double,_3U> result_10;
  Vector<double,_3U> result_11;
  Vector<double,_3U> result_14;
  Vector<double,_3U> result_13;
  double local_1c8 [4];
  double local_1a8 [4];
  double local_188 [10];
  double local_138 [4];
  double local_118 [4];
  double local_f8 [4];
  double local_d8 [4];
  double local_b8 [4];
  double local_98 [4];
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  undefined8 uStack_40;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar9 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar30 = (long)piVar9[idat->atid1];
  if (lVar30 == -1) {
    this->a_uses_SlaterIntra = false;
    this->a_is_Charge = false;
    this->a_is_Dipole = false;
    this->a_is_Quadrupole = false;
    this->a_is_Fluctuating = false;
    local_78 = 0.0;
    bVar31 = 0;
  }
  else {
    pEVar10 = (this->ElectrostaticMap).
              super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = pEVar10 + lVar30;
    pEVar2 = pEVar10 + lVar30;
    bVar7 = pEVar2->is_Dipole;
    bVar8 = pEVar2->is_Quadrupole;
    bVar20 = pEVar2->is_Fluctuating;
    bVar21 = pEVar2->uses_SlaterIntramolecular;
    uVar22 = *(undefined3 *)&pEVar2->field_0x5;
    RVar15 = pEVar2->fixedCharge;
    RVar16 = pEVar10[lVar30].hardness;
    RVar17 = (&pEVar10[lVar30].hardness)[1];
    pEVar10 = pEVar10 + lVar30;
    iVar23 = pEVar10->slaterN;
    uVar29 = *(undefined4 *)&pEVar10->field_0x24;
    RVar18 = *(RealType *)(&pEVar10->slaterN + 2);
    (this->data1).is_Charge = pEVar2->is_Charge;
    (this->data1).is_Dipole = bVar7;
    (this->data1).is_Quadrupole = bVar8;
    (this->data1).is_Fluctuating = bVar20;
    (this->data1).uses_SlaterIntramolecular = bVar21;
    *(undefined3 *)&(this->data1).field_0x5 = uVar22;
    (this->data1).fixedCharge = RVar15;
    (this->data1).hardness = RVar16;
    (this->data1).electronegativity = RVar17;
    (this->data1).slaterN = iVar23;
    *(undefined4 *)&(this->data1).field_0x24 = uVar29;
    (this->data1).slaterZeta = RVar18;
    if (&this->data1 != pEVar1) {
      lVar30 = 0;
      do {
        (this->data1).dipole.super_Vector<double,_3U>.data_[lVar30] =
             *(double *)((long)(pEVar1->dipole).super_Vector<double,_3U>.data_ + lVar30 * 8);
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      pMVar27 = &(this->data1).quadrupole;
      pMVar25 = &pEVar1->quadrupole;
      lVar30 = 0;
      do {
        lVar33 = 0;
        do {
          (pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar33]
               = *(double *)
                  ((long)(pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + lVar33 * 8);
          lVar33 = lVar33 + 1;
        } while (lVar33 != 3);
        lVar30 = lVar30 + 1;
        pMVar27 = (Mat3x3d *)
                  ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
        pMVar25 = (Mat3x3d *)
                  ((long)(pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + 0x18);
      } while (lVar30 != 3);
    }
    local_78._0_1_ = (this->data1).is_Charge;
    local_78._1_1_ = (this->data1).is_Dipole;
    local_78._2_1_ = (this->data1).is_Quadrupole;
    local_78._3_1_ = (this->data1).is_Fluctuating;
    local_78._4_1_ = (this->data1).uses_SlaterIntramolecular;
    local_78._5_3_ = *(undefined3 *)&(this->data1).field_0x5;
    uVar29 = SUB84(local_78,0);
    this->a_is_Charge = (bool)(char)uVar29;
    this->a_is_Dipole = (bool)(char)((uint)uVar29 >> 8);
    this->a_is_Quadrupole = (bool)(char)((uint)uVar29 >> 0x10);
    this->a_is_Fluctuating = (bool)(char)((uint)uVar29 >> 0x18);
    bVar31 = (this->data1).uses_SlaterIntramolecular;
    this->a_uses_SlaterIntra = (bool)bVar31;
  }
  lVar30 = (long)piVar9[idat->atid2];
  if (lVar30 == -1) {
    this->b_uses_SlaterIntra = false;
    this->b_is_Charge = false;
    this->b_is_Dipole = false;
    this->b_is_Quadrupole = false;
    this->b_is_Fluctuating = false;
    bVar37 = 0;
  }
  else {
    pEVar10 = (this->ElectrostaticMap).
              super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = pEVar10 + lVar30;
    pEVar2 = pEVar10 + lVar30;
    bVar7 = pEVar2->is_Dipole;
    bVar8 = pEVar2->is_Quadrupole;
    bVar20 = pEVar2->is_Fluctuating;
    bVar21 = pEVar2->uses_SlaterIntramolecular;
    uVar22 = *(undefined3 *)&pEVar2->field_0x5;
    RVar15 = pEVar2->fixedCharge;
    RVar16 = pEVar10[lVar30].hardness;
    RVar17 = (&pEVar10[lVar30].hardness)[1];
    pEVar10 = pEVar10 + lVar30;
    iVar23 = pEVar10->slaterN;
    uVar29 = *(undefined4 *)&pEVar10->field_0x24;
    RVar18 = *(RealType *)(&pEVar10->slaterN + 2);
    (this->data2).is_Charge = pEVar2->is_Charge;
    (this->data2).is_Dipole = bVar7;
    (this->data2).is_Quadrupole = bVar8;
    (this->data2).is_Fluctuating = bVar20;
    (this->data2).uses_SlaterIntramolecular = bVar21;
    *(undefined3 *)&(this->data2).field_0x5 = uVar22;
    (this->data2).fixedCharge = RVar15;
    (this->data2).hardness = RVar16;
    (this->data2).electronegativity = RVar17;
    (this->data2).slaterN = iVar23;
    *(undefined4 *)&(this->data2).field_0x24 = uVar29;
    (this->data2).slaterZeta = RVar18;
    if (&this->data2 != pEVar1) {
      lVar30 = 0;
      do {
        (this->data2).dipole.super_Vector<double,_3U>.data_[lVar30] =
             *(double *)((long)(pEVar1->dipole).super_Vector<double,_3U>.data_ + lVar30 * 8);
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      pMVar27 = &(this->data2).quadrupole;
      pMVar25 = &pEVar1->quadrupole;
      lVar30 = 0;
      do {
        lVar33 = 0;
        do {
          (pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar33]
               = *(double *)
                  ((long)(pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + lVar33 * 8);
          lVar33 = lVar33 + 1;
        } while (lVar33 != 3);
        lVar30 = lVar30 + 1;
        pMVar27 = (Mat3x3d *)
                  ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
        pMVar25 = (Mat3x3d *)
                  ((long)(pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + 0x18);
      } while (lVar30 != 3);
    }
    bVar7 = (this->data2).is_Dipole;
    bVar8 = (this->data2).is_Quadrupole;
    bVar20 = (this->data2).is_Fluctuating;
    this->b_is_Charge = (this->data2).is_Charge;
    this->b_is_Dipole = bVar7;
    this->b_is_Quadrupole = bVar8;
    this->b_is_Fluctuating = bVar20;
    bVar37 = (this->data2).uses_SlaterIntramolecular;
    this->b_uses_SlaterIntra = (bool)bVar37;
  }
  __s = &this->U;
  t = &idat->rij;
  memset(__s,0,0xf8);
  dVar26 = 1.0 / idat->rij;
  this->ri = dVar26;
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_188[2] = 0.0;
  lVar30 = 1;
  do {
    local_1a8[lVar30 + 3] = (idat->d).super_Vector<double,_3U>.data_[lVar30 + -1] * dVar26;
    lVar30 = lVar30 + 1;
  } while (lVar30 != 4);
  (this->rhat).super_Vector<double,_3U>.data_[2] = local_188[2];
  (this->rhat).super_Vector<double,_3U>.data_[0] = local_188[0];
  (this->rhat).super_Vector<double,_3U>.data_[1] = local_188[1];
  dVar26 = local_78;
  if ((((bVar31 | bVar37) & 1) != 0) && (idat->excluded == true)) {
    piVar9 = (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (undefined8 *)
             (*(long *)&(this->Jij).
                        super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar9[idat->atid1]].
                        super__Vector_base<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
                        ._M_impl.super__Vector_impl_data + (long)piVar9[idat->atid2] * 0x10);
    (this->J).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*puVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->J).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar3 + 1));
    dVar26 = (double)(ulong)this->a_is_Charge;
  }
  if ((((ulong)dVar26 & 1) != 0) || (this->b_is_Charge == true)) {
    CubicSpline::getValueAndDerivativeAt
              ((this->v01s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v01,&this->dv01);
  }
  if ((this->a_is_Dipole != false) || (this->b_is_Dipole == true)) {
    CubicSpline::getValueAndDerivativeAt
              ((this->v11s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v11,&this->dv11);
    this->v11or = this->ri * this->v11;
  }
  if (((this->a_is_Quadrupole != false) || (this->b_is_Quadrupole != false)) ||
     ((bVar31 = this->a_is_Dipole, (bool)bVar31 == true && (this->b_is_Dipole == true)))) {
    CubicSpline::getValueAndDerivativeAt
              ((this->v21s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v21,&this->dv21);
    CubicSpline::getValueAndDerivativeAt
              ((this->v22s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v22,&this->dv22);
    this->v22or = this->ri * this->v22;
    bVar31 = this->a_is_Dipole;
  }
  if ((((bVar31 & 1) != 0) && (this->b_is_Quadrupole != false)) ||
     ((bVar31 = this->a_is_Quadrupole, this->b_is_Dipole == true && ((bVar31 & 1) != 0)))) {
    CubicSpline::getValueAndDerivativeAt
              ((this->v31s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v31,&this->dv31);
    CubicSpline::getValueAndDerivativeAt
              ((this->v32s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v32,&this->dv32);
    this->v31or = this->ri * this->v31;
    this->v32or = this->v32 * this->ri;
    bVar31 = this->a_is_Quadrupole;
  }
  if (((bVar31 & 1) != 0) && (this->b_is_Quadrupole == true)) {
    CubicSpline::getValueAndDerivativeAt
              ((this->v41s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v41,&this->dv41);
    CubicSpline::getValueAndDerivativeAt
              ((this->v42s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v42,&this->dv42);
    CubicSpline::getValueAndDerivativeAt
              ((this->v43s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v43,&this->dv43);
    this->v42or = this->ri * this->v42;
    this->v43or = this->v43 * this->ri;
  }
  bVar7 = this->a_is_Charge;
  if (bVar7 == true) {
    dVar26 = (this->data1).fixedCharge;
    this->C_a = dVar26;
    if (this->a_is_Fluctuating == true) {
      dVar26 = dVar26 + idat->flucQ1;
      this->C_a = dVar26;
    }
    if (idat->excluded == true) {
      idat->skippedCharge2 = dVar26 + idat->skippedCharge2;
    }
    else {
      dVar26 = dVar26 * this->pre11_;
      dVar38 = this->dv01;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar38 * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Eb).super_Vector<double,_3U>.data_[lVar30] =
             (this->Eb).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      this->Pb = dVar26 * this->v01 + this->Pb;
    }
  }
  if (this->a_is_Dipole == true) {
    dVar26 = 0.0;
    lVar30 = 0;
    do {
      dVar26 = dVar26 + (this->rhat).super_Vector<double,_3U>.data_[lVar30] *
                        (idat->D_1).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    this->rdDa = dVar26;
    dVar38 = (idat->D_1).super_Vector<double,_3U>.data_[0];
    dVar40 = (this->rhat).super_Vector<double,_3U>.data_[0];
    dVar4 = (this->rhat).super_Vector<double,_3U>.data_[1];
    dVar39 = (this->rhat).super_Vector<double,_3U>.data_[2];
    dVar41 = (idat->D_1).super_Vector<double,_3U>.data_[1];
    dVar42 = (idat->D_1).super_Vector<double,_3U>.data_[2];
    (this->rxDa).super_Vector<double,_3U>.data_[0] = dVar42 * dVar4 - dVar39 * dVar41;
    (this->rxDa).super_Vector<double,_3U>.data_[1] = dVar38 * dVar39 - dVar40 * dVar42;
    (this->rxDa).super_Vector<double,_3U>.data_[2] = dVar40 * dVar41 - dVar38 * dVar4;
    if (idat->excluded == false) {
      dVar38 = this->pre12_;
      dVar40 = this->dv11;
      dVar4 = this->v11or;
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar30] * (dVar40 - dVar4) * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = (idat->D_1).super_Vector<double,_3U>.data_[lVar30] * dVar4;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] + local_138[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Eb).super_Vector<double,_3U>.data_[lVar30] =
             (this->Eb).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      this->Pb = dVar38 * this->v11 * dVar26 + this->Pb;
    }
  }
  if (this->a_is_Quadrupole == true) {
    pMVar27 = &idat->Q_1;
    dVar26 = (idat->Q_1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
             + (idat->Q_1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
               [1] + (idat->Q_1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                     data_[2][2];
    this->trQa = dVar26;
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    pMVar25 = pMVar27;
    do {
      dVar38 = local_1a8[lVar30 + 4];
      lVar33 = 0;
      do {
        dVar38 = dVar38 + (pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar33] * (this->rhat).super_Vector<double,_3U>.data_[lVar33];
        lVar33 = lVar33 + 1;
      } while (lVar33 != 3);
      local_1a8[lVar30 + 4] = dVar38;
      lVar30 = lVar30 + 1;
      pMVar25 = (Mat3x3d *)
                ((pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                );
    } while (lVar30 != 3);
    (this->Qar).super_Vector<double,_3U>.data_[2] = local_188[2];
    (this->Qar).super_Vector<double,_3U>.data_[0] = local_188[0];
    (this->Qar).super_Vector<double,_3U>.data_[1] = local_188[1];
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    do {
      dVar38 = local_1a8[lVar30 + 4];
      lVar33 = 0;
      pMVar25 = pMVar27;
      do {
        dVar38 = dVar38 + (this->rhat).super_Vector<double,_3U>.data_[lVar33] *
                          (pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][0];
        lVar33 = lVar33 + 1;
        pMVar25 = (Mat3x3d *)
                  ((pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar33 != 3);
      local_1a8[lVar30 + 4] = dVar38;
      lVar30 = lVar30 + 1;
      pMVar27 = (Mat3x3d *)
                ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                + 1);
    } while (lVar30 != 3);
    (this->rQa).super_Vector<double,_3U>.data_[2] = local_188[2];
    (this->rQa).super_Vector<double,_3U>.data_[0] = local_188[0];
    (this->rQa).super_Vector<double,_3U>.data_[1] = local_188[1];
    dVar38 = 0.0;
    lVar30 = 0;
    do {
      dVar38 = dVar38 + (this->rhat).super_Vector<double,_3U>.data_[lVar30] *
                        (this->Qar).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    this->rdQar = dVar38;
    dVar40 = (this->Qar).super_Vector<double,_3U>.data_[0];
    dVar4 = (this->rhat).super_Vector<double,_3U>.data_[0];
    dVar39 = (this->rhat).super_Vector<double,_3U>.data_[1];
    dVar41 = (this->rhat).super_Vector<double,_3U>.data_[2];
    dVar42 = (this->Qar).super_Vector<double,_3U>.data_[1];
    dVar5 = (this->Qar).super_Vector<double,_3U>.data_[2];
    (this->rxQar).super_Vector<double,_3U>.data_[0] = dVar5 * dVar39 - dVar41 * dVar42;
    (this->rxQar).super_Vector<double,_3U>.data_[1] = dVar40 * dVar41 - dVar4 * dVar5;
    (this->rxQar).super_Vector<double,_3U>.data_[2] = dVar4 * dVar42 - dVar40 * dVar39;
    if (idat->excluded == false) {
      dVar40 = this->pre14_;
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar4 = this->dv21;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = local_118[lVar30] * dVar4;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      lVar30 = 0;
      do {
        dVar4 = (this->Qar).super_Vector<double,_3U>.data_[lVar30];
        local_f8[lVar30] = dVar4 + dVar4;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar4 = this->v22or;
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      lVar30 = 0;
      do {
        local_d8[lVar30] = local_f8[lVar30] * dVar4;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] + local_d8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_98[0] = 0.0;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      lVar30 = 0;
      do {
        local_98[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar39 = this->dv22;
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_b8[2] = 0.0;
      lVar30 = 0;
      do {
        local_b8[lVar30] = local_98[lVar30] * (dVar39 - (dVar4 + dVar4));
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] + local_b8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Eb).super_Vector<double,_3U>.data_[lVar30] =
             (this->Eb).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      this->Pb = dVar40 * (dVar26 * this->v21 + dVar38 * this->v22) + this->Pb;
    }
  }
  bVar8 = this->b_is_Charge;
  if (bVar8 == true) {
    dVar26 = (this->data2).fixedCharge;
    this->C_b = dVar26;
    if (this->b_is_Fluctuating == true) {
      dVar26 = dVar26 + idat->flucQ2;
      this->C_b = dVar26;
    }
    if (idat->excluded == true) {
      idat->skippedCharge1 = dVar26 + idat->skippedCharge1;
    }
    else {
      dVar26 = dVar26 * this->pre11_;
      dVar38 = this->dv01;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar38 * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Ea).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Ea).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      this->Pa = dVar26 * this->v01 + this->Pa;
    }
  }
  cVar28 = this->b_is_Dipole;
  if ((bool)cVar28 == true) {
    dVar26 = 0.0;
    lVar30 = 0;
    do {
      dVar26 = dVar26 + (this->rhat).super_Vector<double,_3U>.data_[lVar30] *
                        (idat->D_2).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    this->rdDb = dVar26;
    dVar38 = (idat->D_2).super_Vector<double,_3U>.data_[0];
    dVar40 = (this->rhat).super_Vector<double,_3U>.data_[0];
    dVar4 = (this->rhat).super_Vector<double,_3U>.data_[1];
    dVar39 = (this->rhat).super_Vector<double,_3U>.data_[2];
    dVar41 = (idat->D_2).super_Vector<double,_3U>.data_[1];
    dVar42 = (idat->D_2).super_Vector<double,_3U>.data_[2];
    (this->rxDb).super_Vector<double,_3U>.data_[0] = dVar42 * dVar4 - dVar39 * dVar41;
    (this->rxDb).super_Vector<double,_3U>.data_[1] = dVar38 * dVar39 - dVar40 * dVar42;
    (this->rxDb).super_Vector<double,_3U>.data_[2] = dVar40 * dVar41 - dVar38 * dVar4;
    if (idat->excluded == false) {
      dVar38 = this->pre12_;
      dVar40 = this->dv11;
      dVar4 = this->v11or;
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar30] * (dVar40 - dVar4) * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = (idat->D_2).super_Vector<double,_3U>.data_[lVar30] * dVar4;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] + local_138[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Ea).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Ea).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      this->Pa = dVar38 * this->v11 * dVar26 + this->Pa;
    }
  }
  cVar24 = this->b_is_Quadrupole;
  if ((bool)cVar24 == true) {
    pMVar27 = &idat->Q_2;
    dVar26 = (idat->Q_2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
             + (idat->Q_2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
               [1] + (idat->Q_2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                     data_[2][2];
    this->trQb = dVar26;
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    pMVar25 = pMVar27;
    do {
      dVar38 = local_1a8[lVar30 + 4];
      lVar33 = 0;
      do {
        dVar38 = dVar38 + (pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar33] * (this->rhat).super_Vector<double,_3U>.data_[lVar33];
        lVar33 = lVar33 + 1;
      } while (lVar33 != 3);
      local_1a8[lVar30 + 4] = dVar38;
      lVar30 = lVar30 + 1;
      pMVar25 = (Mat3x3d *)
                ((pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                );
    } while (lVar30 != 3);
    (this->Qbr).super_Vector<double,_3U>.data_[2] = local_188[2];
    (this->Qbr).super_Vector<double,_3U>.data_[0] = local_188[0];
    (this->Qbr).super_Vector<double,_3U>.data_[1] = local_188[1];
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    do {
      dVar38 = local_1a8[lVar30 + 4];
      lVar33 = 0;
      pMVar25 = pMVar27;
      do {
        dVar38 = dVar38 + (this->rhat).super_Vector<double,_3U>.data_[lVar33] *
                          (pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][0];
        lVar33 = lVar33 + 1;
        pMVar25 = (Mat3x3d *)
                  ((pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar33 != 3);
      local_1a8[lVar30 + 4] = dVar38;
      lVar30 = lVar30 + 1;
      pMVar27 = (Mat3x3d *)
                ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                + 1);
    } while (lVar30 != 3);
    (this->rQb).super_Vector<double,_3U>.data_[2] = local_188[2];
    (this->rQb).super_Vector<double,_3U>.data_[0] = local_188[0];
    (this->rQb).super_Vector<double,_3U>.data_[1] = local_188[1];
    dVar38 = 0.0;
    lVar30 = 0;
    do {
      dVar38 = dVar38 + (this->rhat).super_Vector<double,_3U>.data_[lVar30] *
                        (this->Qbr).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    this->rdQbr = dVar38;
    dVar40 = (this->Qbr).super_Vector<double,_3U>.data_[0];
    dVar4 = (this->rhat).super_Vector<double,_3U>.data_[0];
    dVar39 = (this->rhat).super_Vector<double,_3U>.data_[1];
    dVar41 = (this->rhat).super_Vector<double,_3U>.data_[2];
    dVar42 = (this->Qbr).super_Vector<double,_3U>.data_[1];
    dVar5 = (this->Qbr).super_Vector<double,_3U>.data_[2];
    (this->rxQbr).super_Vector<double,_3U>.data_[0] = dVar5 * dVar39 - dVar41 * dVar42;
    (this->rxQbr).super_Vector<double,_3U>.data_[1] = dVar40 * dVar41 - dVar4 * dVar5;
    (this->rxQbr).super_Vector<double,_3U>.data_[2] = dVar4 * dVar42 - dVar40 * dVar39;
    if (idat->excluded == false) {
      dVar40 = this->pre14_;
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar4 = this->dv21;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = local_118[lVar30] * dVar4;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      lVar30 = 0;
      do {
        dVar4 = (this->Qbr).super_Vector<double,_3U>.data_[lVar30];
        local_f8[lVar30] = dVar4 + dVar4;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar4 = this->v22or;
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      lVar30 = 0;
      do {
        local_d8[lVar30] = local_f8[lVar30] * dVar4;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] + local_d8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_98[0] = 0.0;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      lVar30 = 0;
      do {
        local_98[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar39 = this->dv22;
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_b8[2] = 0.0;
      lVar30 = 0;
      do {
        local_b8[lVar30] = local_98[lVar30] * (dVar39 - (dVar4 + dVar4));
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] + local_b8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Ea).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Ea).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      this->Pa = dVar40 * (dVar26 * this->v21 + dVar38 * this->v22) + this->Pa;
    }
  }
  if (bVar7 == false) goto LAB_002822c7;
  if (bVar8 != false) {
    dVar26 = this->v01;
    dVar39 = this->pre11_ * idat->electroMult;
    this->pref = dVar39;
    dVar38 = this->C_a;
    dVar40 = this->C_b;
    dVar41 = dVar38 * dVar40 * dVar39;
    this->U = dVar41 * dVar26 + this->U;
    dVar4 = this->dv01;
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    do {
      local_1a8[lVar30 + 4] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar41 * dVar4;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    lVar30 = 0;
    do {
      (this->F).super_Vector<double,_3U>.data_[lVar30] =
           local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    bVar7 = idat->excluded;
    if ((this->summationMethod_ == esm_REACTION_FIELD) && ((bVar7 & 1U) != 0)) {
      dVar41 = this->preRF_ * dVar39 * dVar38 * dVar40 * idat->r2;
      this->rfContrib = dVar41;
      this->indirect_Pot = this->indirect_Pot + dVar41;
      dVar4 = this->ri;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar30] * (dVar41 + dVar41) * dVar4;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->indirect_F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->indirect_F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
    }
    if ((bVar7 & 1U) == 0) {
      if (this->a_is_Fluctuating == true) {
        this->dUdCa = dVar40 * dVar39 * dVar26 + this->dUdCa;
      }
      if (this->b_is_Fluctuating == true) {
        dVar39 = dVar39 * dVar38;
LAB_00281caa:
        this->dUdCb = dVar39 * dVar26 + this->dUdCb;
      }
    }
    else if ((this->a_uses_SlaterIntra != false) || (this->b_uses_SlaterIntra == true)) {
      dVar26 = CubicSpline::getValueAt
                         ((this->J).
                          super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,t);
      this->coulInt = dVar26;
      dVar39 = this->C_a;
      this->excluded_Pot = dVar39 * this->C_b * dVar26 + this->excluded_Pot;
      if (this->a_is_Fluctuating == true) {
        this->dUdCa = this->C_b * dVar26 + this->dUdCa;
      }
      if (this->b_is_Fluctuating == true) goto LAB_00281caa;
    }
  }
  cVar28 = this->b_is_Dipole;
  if ((bool)cVar28 == true) {
    dVar41 = this->pre12_ * idat->electroMult;
    dVar26 = this->v11;
    this->pref = dVar41;
    dVar39 = this->C_a * dVar41;
    dVar42 = dVar39 * dVar26;
    dVar38 = this->rdDb;
    this->U = dVar42 * dVar38 + this->U;
    dVar40 = this->dv11;
    dVar4 = this->v11or;
    local_1a8[0] = 0.0;
    local_1a8[1] = 0.0;
    local_1a8[2] = 0.0;
    lVar30 = 0;
    do {
      local_1a8[lVar30] =
           (this->rhat).super_Vector<double,_3U>.data_[lVar30] * (dVar40 - dVar4) * dVar38;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar30 = 0;
    do {
      local_138[lVar30] = (idat->D_2).super_Vector<double,_3U>.data_[lVar30] * dVar4;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    local_1c8[0] = 0.0;
    local_1c8[1] = 0.0;
    local_1c8[2] = 0.0;
    lVar30 = 0;
    do {
      local_1c8[lVar30] = local_1a8[lVar30] + local_138[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    do {
      local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar39;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    lVar30 = 0;
    do {
      (this->F).super_Vector<double,_3U>.data_[lVar30] =
           local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    do {
      local_1a8[lVar30 + 4] = (this->rxDb).super_Vector<double,_3U>.data_[lVar30] * dVar42;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    lVar30 = 0;
    do {
      (this->Tb).super_Vector<double,_3U>.data_[lVar30] =
           local_1a8[lVar30 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    if (this->a_is_Fluctuating == true) {
      this->dUdCa = dVar41 * dVar26 * dVar38 + this->dUdCa;
    }
    if ((this->summationMethod_ == esm_REACTION_FIELD) && (idat->excluded == true)) {
      dVar39 = dVar39 * this->preRF_;
      dVar26 = *t;
      dVar40 = (dVar39 + dVar39) * dVar26;
      this->rfContrib = dVar40;
      this->indirect_Pot = dVar38 * dVar40 + this->indirect_Pot;
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = (idat->D_2).super_Vector<double,_3U>.data_[lVar30] * dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] / dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->indirect_F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->indirect_F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = (this->rxDb).super_Vector<double,_3U>.data_[lVar30] * dVar39;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->indirect_Tb).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->indirect_Tb).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
    }
  }
  cVar24 = this->b_is_Quadrupole;
  if ((bool)cVar24 == true) {
    dVar26 = this->v22;
    dVar39 = this->pre14_ * idat->electroMult;
    this->pref = dVar39;
    dVar42 = this->C_a * dVar39;
    dVar38 = this->trQb;
    dVar40 = this->rdQbr;
    dVar41 = this->v21 * dVar38 + dVar26 * dVar40;
    this->U = dVar42 * dVar41 + this->U;
    dVar4 = this->dv21;
    local_1a8[0] = 0.0;
    local_1a8[1] = 0.0;
    local_1a8[2] = 0.0;
    lVar30 = 0;
    do {
      local_1a8[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar38 * dVar4;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    local_118[0] = 0.0;
    local_118[1] = 0.0;
    local_118[2] = 0.0;
    lVar30 = 0;
    do {
      dVar38 = (this->Qbr).super_Vector<double,_3U>.data_[lVar30];
      local_118[lVar30] = dVar38 + dVar38;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    dVar38 = this->v22or;
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar30 = 0;
    do {
      local_138[lVar30] = local_118[lVar30] * dVar38;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    local_1c8[0] = 0.0;
    local_1c8[1] = 0.0;
    local_1c8[2] = 0.0;
    lVar30 = 0;
    do {
      local_1c8[lVar30] = local_1a8[lVar30] + local_138[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    do {
      local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar42;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    lVar30 = 0;
    do {
      (this->F).super_Vector<double,_3U>.data_[lVar30] =
           local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    local_1c8[0] = 0.0;
    local_1c8[1] = 0.0;
    local_1c8[2] = 0.0;
    lVar30 = 0;
    do {
      local_1c8[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar40 * dVar42;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    dVar40 = this->dv22;
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    do {
      local_1a8[lVar30 + 4] = local_1c8[lVar30] * (dVar40 - (dVar38 + dVar38));
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    lVar30 = 0;
    do {
      (this->F).super_Vector<double,_3U>.data_[lVar30] =
           local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    local_1c8[0] = 0.0;
    local_1c8[1] = 0.0;
    local_1c8[2] = 0.0;
    lVar30 = 0;
    do {
      local_1c8[lVar30] = (this->rxQbr).super_Vector<double,_3U>.data_[lVar30] * (dVar42 + dVar42);
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    do {
      local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar26;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    lVar30 = 0;
    do {
      (this->Tb).super_Vector<double,_3U>.data_[lVar30] =
           local_1a8[lVar30 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    if (this->a_is_Fluctuating == true) {
      this->dUdCa = dVar39 * dVar41 + this->dUdCa;
    }
  }
LAB_002822c7:
  if (this->a_is_Dipole == true) {
    if (this->b_is_Charge == true) {
      dVar41 = this->pre12_ * idat->electroMult;
      dVar26 = this->v11;
      this->pref = dVar41;
      dVar38 = this->rdDa;
      dVar39 = this->C_b * dVar41;
      dVar42 = dVar39 * dVar26;
      this->U = this->U - dVar42 * dVar38;
      dVar40 = this->dv11;
      dVar4 = this->v11or;
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar30] * (dVar40 - dVar4) * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = (idat->D_1).super_Vector<double,_3U>.data_[lVar30] * dVar4;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] + local_138[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar39;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             (this->F).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = (this->rxDa).super_Vector<double,_3U>.data_[lVar30] * dVar42;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar30] =
             (this->Ta).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      if (this->b_is_Fluctuating == true) {
        this->dUdCb = this->dUdCb - dVar26 * dVar41 * dVar38;
      }
      if ((this->summationMethod_ == esm_REACTION_FIELD) && (idat->excluded == true)) {
        dVar39 = dVar39 * this->preRF_;
        dVar26 = *t;
        dVar40 = (dVar39 + dVar39) * dVar26;
        this->rfContrib = dVar40;
        this->indirect_Pot = this->indirect_Pot - dVar38 * dVar40;
        local_1c8[0] = 0.0;
        local_1c8[1] = 0.0;
        local_1c8[2] = 0.0;
        lVar30 = 0;
        do {
          local_1c8[lVar30] = (idat->D_1).super_Vector<double,_3U>.data_[lVar30] * dVar40;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 3);
        local_188[0] = 0.0;
        local_188[1] = 0.0;
        local_188[2] = 0.0;
        lVar30 = 0;
        do {
          local_1a8[lVar30 + 4] = local_1c8[lVar30] / dVar26;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 3);
        lVar30 = 0;
        do {
          (this->indirect_F).super_Vector<double,_3U>.data_[lVar30] =
               (this->indirect_F).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
          lVar30 = lVar30 + 1;
        } while (lVar30 != 3);
        local_188[0] = 0.0;
        local_188[1] = 0.0;
        local_188[2] = 0.0;
        lVar30 = 0;
        do {
          local_1a8[lVar30 + 4] = (this->rxDa).super_Vector<double,_3U>.data_[lVar30] * dVar39;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 3);
        lVar30 = 0;
        do {
          (this->indirect_Ta).super_Vector<double,_3U>.data_[lVar30] =
               (this->indirect_Ta).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
          lVar30 = lVar30 + 1;
        } while (lVar30 != 3);
      }
    }
    if (cVar28 != '\0') {
      dVar38 = this->pre22_ * idat->electroMult;
      this->pref = dVar38;
      dVar26 = 0.0;
      lVar30 = -0x18;
      do {
        dVar26 = dVar26 + *(double *)((long)(idat->D_2).super_Vector<double,_3U>.data_ + lVar30) *
                          *(double *)
                           ((long)(idat->Q_1).super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0] + lVar30);
        lVar30 = lVar30 + 8;
      } while (lVar30 != 0);
      this->DadDb = dVar26;
      dVar40 = (idat->D_2).super_Vector<double,_3U>.data_[0];
      dVar4 = (idat->D_1).super_Vector<double,_3U>.data_[0];
      dVar39 = (idat->D_1).super_Vector<double,_3U>.data_[1];
      dVar41 = (idat->D_1).super_Vector<double,_3U>.data_[2];
      dVar42 = (idat->D_2).super_Vector<double,_3U>.data_[1];
      dVar5 = (idat->D_2).super_Vector<double,_3U>.data_[2];
      (this->DaxDb).super_Vector<double,_3U>.data_[0] = dVar5 * dVar39 - dVar41 * dVar42;
      (this->DaxDb).super_Vector<double,_3U>.data_[1] = dVar40 * dVar41 - dVar4 * dVar5;
      (this->DaxDb).super_Vector<double,_3U>.data_[2] = dVar4 * dVar42 - dVar40 * dVar39;
      dVar40 = this->v21;
      dVar4 = this->v22;
      dVar39 = this->rdDa;
      dVar41 = this->rdDb;
      this->U = this->U - (dVar26 * dVar40 + dVar39 * dVar41 * dVar4) * dVar38;
      dVar42 = this->dv21;
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar42 * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar42 = this->v22or;
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      lVar30 = 0;
      do {
        local_d8[lVar30] = (idat->D_1).super_Vector<double,_3U>.data_[lVar30] * dVar41;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      lVar30 = 0;
      do {
        local_f8[lVar30] = (idat->D_2).super_Vector<double,_3U>.data_[lVar30] * dVar39;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = local_d8[lVar30] + local_f8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = local_118[lVar30] * dVar42;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] + local_138[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             (this->F).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar5 = this->dv22;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar30] *
             (dVar5 - (dVar42 + dVar42)) * dVar39 * dVar41 * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             (this->F).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = (this->DaxDb).super_Vector<double,_3U>.data_[lVar30] * dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = (this->rxDa).super_Vector<double,_3U>.data_[lVar30] * dVar41 * dVar4;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] - local_138[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = (this->DaxDb).super_Vector<double,_3U>.data_[lVar30] * -dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = (this->rxDb).super_Vector<double,_3U>.data_[lVar30] * dVar39 * dVar4;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] - local_138[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Tb).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      if ((this->summationMethod_ == esm_REACTION_FIELD) && (idat->excluded == true)) {
        dVar38 = -dVar38 * this->preRF_;
        dVar38 = dVar38 + dVar38;
        this->rfContrib = dVar38;
        this->indirect_Pot = dVar26 * dVar38 + this->indirect_Pot;
        local_188[0] = 0.0;
        local_188[1] = 0.0;
        local_188[2] = 0.0;
        lVar30 = 0;
        do {
          local_1a8[lVar30 + 4] = (this->DaxDb).super_Vector<double,_3U>.data_[lVar30] * dVar38;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 3);
        lVar30 = 0;
        do {
          (this->indirect_Ta).super_Vector<double,_3U>.data_[lVar30] =
               local_1a8[lVar30 + 4] + (this->indirect_Ta).super_Vector<double,_3U>.data_[lVar30];
          lVar30 = lVar30 + 1;
        } while (lVar30 != 3);
        dVar26 = this->rfContrib;
        local_188[0] = 0.0;
        local_188[1] = 0.0;
        local_188[2] = 0.0;
        lVar30 = 0;
        do {
          local_1a8[lVar30 + 4] = (this->DaxDb).super_Vector<double,_3U>.data_[lVar30] * dVar26;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 3);
        lVar30 = 0;
        do {
          (this->indirect_Tb).super_Vector<double,_3U>.data_[lVar30] =
               (this->indirect_Tb).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
          lVar30 = lVar30 + 1;
        } while (lVar30 != 3);
      }
    }
    if (cVar24 != '\0') {
      dVar26 = this->pre24_ * idat->electroMult;
      this->pref = dVar26;
      pMVar27 = &idat->Q_2;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        dVar38 = local_1a8[lVar30 + 4];
        lVar33 = 0;
        pMVar25 = pMVar27;
        do {
          dVar38 = dVar38 + (idat->D_1).super_Vector<double,_3U>.data_[lVar33] *
                            (pMVar25->super_SquareMatrix<double,_3>).
                            super_RectMatrix<double,_3U,_3U>.data_[0][0];
          lVar33 = lVar33 + 1;
          pMVar25 = (Mat3x3d *)
                    ((pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
        } while (lVar33 != 3);
        local_1a8[lVar30 + 4] = dVar38;
        lVar30 = lVar30 + 1;
        pMVar27 = (Mat3x3d *)
                  ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                   [0] + 1);
      } while (lVar30 != 3);
      (this->DadQb).super_Vector<double,_3U>.data_[2] = local_188[2];
      (this->DadQb).super_Vector<double,_3U>.data_[0] = local_188[0];
      (this->DadQb).super_Vector<double,_3U>.data_[1] = local_188[1];
      dVar38 = 0.0;
      lVar30 = 0;
      do {
        dVar38 = dVar38 + (idat->D_1).super_Vector<double,_3U>.data_[lVar30] *
                          (this->Qbr).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      this->DadQbr = dVar38;
      dVar40 = (this->Qbr).super_Vector<double,_3U>.data_[0];
      dVar4 = (idat->D_1).super_Vector<double,_3U>.data_[0];
      dVar39 = (idat->D_1).super_Vector<double,_3U>.data_[1];
      dVar41 = (idat->D_1).super_Vector<double,_3U>.data_[2];
      dVar42 = (this->Qbr).super_Vector<double,_3U>.data_[1];
      dVar5 = (this->Qbr).super_Vector<double,_3U>.data_[2];
      (this->DaxQbr).super_Vector<double,_3U>.data_[0] = dVar5 * dVar39 - dVar41 * dVar42;
      (this->DaxQbr).super_Vector<double,_3U>.data_[1] = dVar40 * dVar41 - dVar4 * dVar5;
      (this->DaxQbr).super_Vector<double,_3U>.data_[2] = dVar4 * dVar42 - dVar40 * dVar39;
      dVar40 = this->trQb;
      dVar4 = this->rdDa;
      dVar42 = dVar40 * dVar4 + dVar38 + dVar38;
      dVar38 = this->v31;
      dVar39 = this->v32;
      dVar41 = this->rdQbr;
      this->U = this->U - (dVar42 * dVar38 + dVar4 * dVar41 * dVar39) * dVar26;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = (idat->D_1).super_Vector<double,_3U>.data_[lVar30] * dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        dVar5 = (this->DadQb).super_Vector<double,_3U>.data_[lVar30];
        local_118[lVar30] = dVar5 + dVar5;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] + local_118[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar5 = this->v31or;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar5;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             (this->F).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar6 = this->dv31;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar30] * (dVar6 - dVar5) * dVar42 * dVar26
        ;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             (this->F).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = (idat->D_1).super_Vector<double,_3U>.data_[lVar30] * dVar41;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = (this->rQb).super_Vector<double,_3U>.data_[lVar30] * (dVar4 + dVar4);
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] + local_118[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar42 = this->v32or;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar42;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             (this->F).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar4 * dVar41;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar5 = this->dv32;
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * (dVar42 * -3.0 + dVar5);
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             (this->F).super_Vector<double,_3U>.data_[lVar30] - local_1a8[lVar30 + 4];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = (this->rxDa).super_Vector<double,_3U>.data_[lVar30] * -dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      lVar30 = 0;
      do {
        dVar40 = (this->DaxQbr).super_Vector<double,_3U>.data_[lVar30];
        local_d8[lVar30] = dVar40 + dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = local_118[lVar30] + local_d8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_b8[2] = 0.0;
      lVar30 = 0;
      do {
        local_b8[lVar30] = (this->rxDa).super_Vector<double,_3U>.data_[lVar30] * dVar41;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      lVar30 = 0;
      do {
        local_f8[lVar30] = local_b8[lVar30] * dVar39;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] - local_f8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar40 = (this->rhat).super_Vector<double,_3U>.data_[0];
      dVar41 = (this->DadQb).super_Vector<double,_3U>.data_[0];
      dVar42 = (this->DadQb).super_Vector<double,_3U>.data_[1];
      dVar5 = (this->DadQb).super_Vector<double,_3U>.data_[2];
      dVar6 = (this->rhat).super_Vector<double,_3U>.data_[1];
      dVar12 = (this->rhat).super_Vector<double,_3U>.data_[2];
      local_d8[0] = dVar12 * dVar42 - dVar5 * dVar6;
      local_d8[1] = dVar40 * dVar5 - dVar41 * dVar12;
      local_d8[2] = dVar41 * dVar6 - dVar40 * dVar42;
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = local_d8[lVar30] + local_d8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      lVar30 = 0;
      do {
        dVar40 = (this->DaxQbr).super_Vector<double,_3U>.data_[lVar30];
        local_f8[lVar30] = dVar40 + dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = local_118[lVar30] - local_f8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_98[0] = 0.0;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      lVar30 = 0;
      do {
        local_98[lVar30] = (this->rxQbr).super_Vector<double,_3U>.data_[lVar30] * (dVar4 + dVar4);
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_b8[2] = 0.0;
      lVar30 = 0;
      do {
        local_b8[lVar30] = local_98[lVar30] * dVar39;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] - local_b8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Tb).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
    }
  }
  if (this->a_is_Quadrupole == true) {
    if (this->b_is_Charge == true) {
      dVar4 = this->pre14_ * idat->electroMult;
      dVar26 = this->v22;
      this->pref = dVar4;
      dVar41 = this->C_b * dVar4;
      dVar38 = this->trQa;
      dVar40 = this->rdQar;
      dVar39 = this->v21 * dVar38 + dVar26 * dVar40;
      this->U = dVar41 * dVar39 + this->U;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar38 = this->dv21;
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      lVar30 = 0;
      do {
        dVar38 = (this->Qar).super_Vector<double,_3U>.data_[lVar30];
        local_d8[lVar30] = dVar38 + dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar38 = this->v22or;
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = local_d8[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] + local_118[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar41;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar40 * dVar41;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar40 = this->dv22;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * (dVar40 - (dVar38 + dVar38));
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = (this->rxQar).super_Vector<double,_3U>.data_[lVar30] * (dVar41 + dVar41)
        ;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      if (this->b_is_Fluctuating == true) {
        this->dUdCb = dVar4 * dVar39 + this->dUdCb;
      }
    }
    if (this->b_is_Dipole == true) {
      dVar26 = this->pre24_ * idat->electroMult;
      this->pref = dVar26;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      pMVar27 = &idat->Q_1;
      do {
        dVar38 = local_1a8[lVar30 + 4];
        lVar33 = -0x18;
        pMVar25 = pMVar27;
        do {
          dVar38 = dVar38 + *(double *)
                             ((long)(idat->Q_1).super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_[0] + lVar33) *
                            (pMVar25->super_SquareMatrix<double,_3>).
                            super_RectMatrix<double,_3U,_3U>.data_[0][0];
          pMVar25 = (Mat3x3d *)
                    ((pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
          lVar33 = lVar33 + 8;
        } while (lVar33 != 0);
        local_1a8[lVar30 + 4] = dVar38;
        lVar30 = lVar30 + 1;
        pMVar27 = (Mat3x3d *)
                  ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                   [0] + 1);
      } while (lVar30 != 3);
      (this->DbdQa).super_Vector<double,_3U>.data_[2] = local_188[2];
      (this->DbdQa).super_Vector<double,_3U>.data_[0] = local_188[0];
      (this->DbdQa).super_Vector<double,_3U>.data_[1] = local_188[1];
      dVar38 = 0.0;
      lVar30 = 0;
      do {
        dVar38 = dVar38 + (idat->D_2).super_Vector<double,_3U>.data_[lVar30] *
                          (this->Qar).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      this->DbdQar = dVar38;
      dVar40 = (this->Qar).super_Vector<double,_3U>.data_[0];
      dVar4 = (idat->D_2).super_Vector<double,_3U>.data_[0];
      dVar39 = (idat->D_2).super_Vector<double,_3U>.data_[1];
      dVar41 = (idat->D_2).super_Vector<double,_3U>.data_[2];
      dVar42 = (this->Qar).super_Vector<double,_3U>.data_[1];
      dVar5 = (this->Qar).super_Vector<double,_3U>.data_[2];
      (this->DbxQar).super_Vector<double,_3U>.data_[0] = dVar5 * dVar39 - dVar41 * dVar42;
      (this->DbxQar).super_Vector<double,_3U>.data_[1] = dVar40 * dVar41 - dVar4 * dVar5;
      (this->DbxQar).super_Vector<double,_3U>.data_[2] = dVar4 * dVar42 - dVar40 * dVar39;
      dVar40 = this->trQa;
      dVar4 = this->rdDb;
      dVar42 = dVar40 * dVar4 + dVar38 + dVar38;
      dVar38 = this->v31;
      dVar39 = this->v32;
      dVar41 = this->rdQar;
      this->U = (dVar42 * dVar38 + dVar4 * dVar41 * dVar39) * dVar26 + this->U;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = (idat->D_2).super_Vector<double,_3U>.data_[lVar30] * dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        dVar5 = (this->DbdQa).super_Vector<double,_3U>.data_[lVar30];
        local_118[lVar30] = dVar5 + dVar5;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] + local_118[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar5 = this->v31or;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar5;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar6 = this->dv31;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar30] * (dVar6 - dVar5) * dVar42 * dVar26
        ;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = (idat->D_2).super_Vector<double,_3U>.data_[lVar30] * dVar41;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = (this->rQa).super_Vector<double,_3U>.data_[lVar30] * (dVar4 + dVar4);
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] + local_118[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar42 = this->v32or;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar42;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar4 * dVar41;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar5 = this->dv32;
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * (dVar42 * -3.0 + dVar5);
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar42 = (this->rhat).super_Vector<double,_3U>.data_[0];
      dVar5 = (this->DbdQa).super_Vector<double,_3U>.data_[0];
      dVar6 = (this->DbdQa).super_Vector<double,_3U>.data_[1];
      dVar12 = (this->DbdQa).super_Vector<double,_3U>.data_[2];
      dVar13 = (this->rhat).super_Vector<double,_3U>.data_[1];
      dVar43 = (this->rhat).super_Vector<double,_3U>.data_[2];
      local_d8[0] = dVar43 * dVar6 - dVar12 * dVar13;
      local_d8[1] = dVar42 * dVar12 - dVar5 * dVar43;
      local_d8[2] = dVar5 * dVar13 - dVar42 * dVar6;
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = local_d8[lVar30] * -2.0;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      lVar30 = 0;
      do {
        dVar42 = (this->DbxQar).super_Vector<double,_3U>.data_[lVar30];
        local_f8[lVar30] = dVar42 + dVar42;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = local_118[lVar30] + local_f8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_98[0] = 0.0;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      lVar30 = 0;
      do {
        local_98[lVar30] = (this->rxQar).super_Vector<double,_3U>.data_[lVar30] * (dVar4 + dVar4);
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_b8[2] = 0.0;
      lVar30 = 0;
      do {
        local_b8[lVar30] = local_98[lVar30] * dVar39;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] + local_b8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = (this->rxDb).super_Vector<double,_3U>.data_[lVar30] * dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      lVar30 = 0;
      do {
        dVar40 = (this->DbxQar).super_Vector<double,_3U>.data_[lVar30];
        local_d8[lVar30] = dVar40 + dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = local_118[lVar30] - local_d8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_b8[2] = 0.0;
      lVar30 = 0;
      do {
        local_b8[lVar30] = (this->rxDb).super_Vector<double,_3U>.data_[lVar30] * dVar41;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      lVar30 = 0;
      do {
        local_f8[lVar30] = local_b8[lVar30] * dVar39;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] + local_f8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Tb).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
    }
    if (this->b_is_Quadrupole == true) {
      dVar26 = this->pre44_ * idat->electroMult;
      this->pref = dVar26;
      pMVar27 = &idat->Q_1;
      local_188[6] = 0.0;
      local_188[7] = 0.0;
      local_188[4] = 0.0;
      local_188[5] = 0.0;
      local_188[2] = 0.0;
      local_188[3] = 0.0;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[8] = 0.0;
      lVar30 = 0;
      do {
        lVar33 = 0;
        pMVar25 = &idat->Q_2;
        do {
          dVar38 = local_1a8[lVar30 * 3 + lVar33 + 4];
          lVar35 = 0;
          pMVar32 = pMVar25;
          do {
            dVar38 = dVar38 + (pMVar27->super_SquareMatrix<double,_3>).
                              super_RectMatrix<double,_3U,_3U>.data_[0][lVar35] *
                              (pMVar32->super_SquareMatrix<double,_3>).
                              super_RectMatrix<double,_3U,_3U>.data_[0][0];
            lVar35 = lVar35 + 1;
            pMVar32 = (Mat3x3d *)
                      ((pMVar32->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_ + 1);
          } while (lVar35 != 3);
          local_1a8[lVar30 * 3 + lVar33 + 4] = dVar38;
          lVar33 = lVar33 + 1;
          pMVar25 = (Mat3x3d *)
                    ((pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                     [0] + 1);
        } while (lVar33 != 3);
        lVar30 = lVar30 + 1;
        pMVar27 = (Mat3x3d *)
                  ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar30 != 3);
      pMVar27 = &this->QaQb;
      lVar30 = 0;
      do {
        *(undefined8 *)
         ((long)(this->QaQb).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
         + lVar30 + 0x10) = *(undefined8 *)((long)local_1a8 + lVar30 + 0x30);
        uVar19 = *(undefined8 *)((long)local_1a8 + lVar30 + 0x28);
        puVar3 = (undefined8 *)
                 ((long)(pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar30);
        *puVar3 = *(undefined8 *)((long)local_1a8 + lVar30 + 0x20);
        puVar3[1] = uVar19;
        lVar30 = lVar30 + 0x18;
      } while (lVar30 != 0x48);
      dVar38 = (this->QaQb).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
               [0] + (this->QaQb).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                     data_[1][1] +
               (this->QaQb).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
               [2];
      this->trQaQb = dVar38;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      pMVar25 = pMVar27;
      do {
        dVar40 = local_1a8[lVar30 + 4];
        lVar33 = 0;
        pMVar32 = pMVar25;
        do {
          dVar40 = dVar40 + (this->rhat).super_Vector<double,_3U>.data_[lVar33] *
                            (pMVar32->super_SquareMatrix<double,_3>).
                            super_RectMatrix<double,_3U,_3U>.data_[0][0];
          lVar33 = lVar33 + 1;
          pMVar32 = (Mat3x3d *)
                    ((pMVar32->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
        } while (lVar33 != 3);
        local_1a8[lVar30 + 4] = dVar40;
        lVar30 = lVar30 + 1;
        pMVar25 = (Mat3x3d *)
                  ((pMVar25->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                   [0] + 1);
      } while (lVar30 != 3);
      (this->rQaQb).super_Vector<double,_3U>.data_[2] = local_188[2];
      (this->rQaQb).super_Vector<double,_3U>.data_[0] = local_188[0];
      (this->rQaQb).super_Vector<double,_3U>.data_[1] = local_188[1];
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        dVar40 = local_1a8[lVar30 + 4];
        lVar33 = 0;
        do {
          dVar40 = dVar40 + (pMVar27->super_SquareMatrix<double,_3>).
                            super_RectMatrix<double,_3U,_3U>.data_[0][lVar33] *
                            (this->rhat).super_Vector<double,_3U>.data_[lVar33];
          lVar33 = lVar33 + 1;
        } while (lVar33 != 3);
        local_1a8[lVar30 + 4] = dVar40;
        lVar30 = lVar30 + 1;
        pMVar27 = (Mat3x3d *)
                  ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar30 != 3);
      (this->QaQbr).super_Vector<double,_3U>.data_[2] = local_188[2];
      (this->QaQbr).super_Vector<double,_3U>.data_[0] = local_188[0];
      (this->QaQbr).super_Vector<double,_3U>.data_[1] = local_188[1];
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        lVar35 = lVar30 + 1;
        uVar34 = (ulong)((int)lVar30 - 1);
        lVar33 = lVar35;
        if (lVar35 == 3) {
          lVar33 = 0;
        }
        if (lVar30 == 0) {
          uVar34 = 2;
        }
        dVar40 = local_1a8[lVar30 + 4];
        lVar36 = 0;
        do {
          dVar40 = dVar40 + ((idat->Q_1).super_SquareMatrix<double,_3>.
                             super_RectMatrix<double,_3U,_3U>.data_[lVar33][lVar36] *
                             (idat->Q_2).super_SquareMatrix<double,_3>.
                             super_RectMatrix<double,_3U,_3U>.data_[uVar34][lVar36] -
                            (idat->Q_2).super_SquareMatrix<double,_3>.
                            super_RectMatrix<double,_3U,_3U>.data_[lVar33][lVar36] *
                            (idat->Q_1).super_SquareMatrix<double,_3>.
                            super_RectMatrix<double,_3U,_3U>.data_[uVar34][lVar36]);
          lVar36 = lVar36 + 1;
        } while (lVar36 != 3);
        local_1a8[lVar30 + 4] = dVar40;
        lVar30 = lVar35;
      } while (lVar35 != 3);
      (this->QaxQb).super_Vector<double,_3U>.data_[2] = local_188[2];
      (this->QaxQb).super_Vector<double,_3U>.data_[0] = local_188[0];
      (this->QaxQb).super_Vector<double,_3U>.data_[1] = local_188[1];
      dVar40 = 0.0;
      lVar30 = -0x18;
      do {
        dVar40 = dVar40 + *(double *)((long)(this->rQb).super_Vector<double,_3U>.data_ + lVar30) *
                          *(double *)((long)(this->rQa).super_Vector<double,_3U>.data_ + lVar30);
        lVar30 = lVar30 + 8;
      } while (lVar30 != 0);
      this->rQaQbr = dVar40;
      local_78 = (this->Qbr).super_Vector<double,_3U>.data_[1];
      dStack_70 = (this->Qbr).super_Vector<double,_3U>.data_[2];
      local_48 = (this->Qbr).super_Vector<double,_3U>.data_[0];
      dVar4 = (this->rQa).super_Vector<double,_3U>.data_[0];
      dVar12 = (this->rQa).super_Vector<double,_3U>.data_[1];
      dVar13 = (this->rQa).super_Vector<double,_3U>.data_[2];
      uStack_40 = 0;
      local_58 = dStack_70;
      dStack_50 = local_48;
      (this->rQaxQbr).super_Vector<double,_3U>.data_[0] = dVar12 * dStack_70 - local_78 * dVar13;
      (this->rQaxQbr).super_Vector<double,_3U>.data_[1] = dVar13 * local_48 - dStack_70 * dVar4;
      (this->rQaxQbr).super_Vector<double,_3U>.data_[2] = dVar4 * local_78 - local_48 * dVar12;
      dVar39 = this->trQa;
      dVar41 = this->trQb;
      dVar44 = dVar39 * dVar41 + dVar38 + dVar38;
      dVar38 = this->v41;
      dVar42 = this->v42;
      dVar5 = this->rdQbr;
      dVar6 = this->rdQar;
      dVar43 = dVar40 * 4.0 + dVar39 * dVar5 + dVar41 * dVar6;
      dVar40 = this->v43;
      this->U = dVar26 * dVar5 * dVar6 * dVar40 +
                dVar26 * dVar43 * dVar42 + dVar26 * dVar44 * dVar38 + this->U;
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_68 = -dVar12;
      dStack_60 = -dVar13;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar44;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar44 = this->dv41;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar44;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar43;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar43 = this->dv42;
      dVar44 = this->v42or;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * (dVar43 - (dVar44 + dVar44));
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = (this->rhat).super_Vector<double,_3U>.data_[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar5 * dVar6;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar43 = this->v43or;
      dVar45 = this->dv43;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * (dVar43 * -4.0 + dVar45);
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = (this->rQa).super_Vector<double,_3U>.data_[lVar30] * dVar41;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = (this->rQb).super_Vector<double,_3U>.data_[lVar30] * dVar39;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] + local_118[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar45 = dVar26 + dVar26;
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar45;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar44;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] =
             (this->rQaQb).super_Vector<double,_3U>.data_[lVar30] +
             (this->QaQbr).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar26 * 4.0;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar44;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = (this->rQa).super_Vector<double,_3U>.data_[lVar30] * dVar5;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = (this->rQb).super_Vector<double,_3U>.data_[lVar30] * dVar6;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] + local_118[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar45;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar43;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = (this->QaxQb).super_Vector<double,_3U>.data_[lVar30] * -4.0;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar44 = (this->rhat).super_Vector<double,_3U>.data_[1];
      dVar14 = (this->rhat).super_Vector<double,_3U>.data_[2];
      dVar43 = (this->rhat).super_Vector<double,_3U>.data_[0];
      local_d8[0] = dVar12 * dVar14 + -dVar13 * dVar44;
      local_d8[1] = dVar13 * dVar43 + -dVar4 * dVar14;
      local_d8[2] = dVar4 * dVar44 + -dVar12 * dVar43;
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = local_d8[lVar30] * dVar41 * -2.0;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar4 = (this->QaQbr).super_Vector<double,_3U>.data_[0];
      dVar41 = (this->QaQbr).super_Vector<double,_3U>.data_[1];
      dVar12 = (this->QaQbr).super_Vector<double,_3U>.data_[2];
      local_b8[0] = dVar44 * dVar12 - dVar14 * dVar41;
      local_b8[1] = dVar14 * dVar4 - dVar43 * dVar12;
      local_b8[2] = dVar43 * dVar41 - dVar44 * dVar4;
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      lVar30 = 0;
      do {
        local_f8[lVar30] = local_b8[lVar30] * 4.0;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = local_118[lVar30] + local_f8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_98[0] = 0.0;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      lVar30 = 0;
      do {
        local_98[lVar30] = (this->rQaxQbr).super_Vector<double,_3U>.data_[lVar30] * 4.0;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] - local_98[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar42;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar4 = (this->Qar).super_Vector<double,_3U>.data_[0];
      dVar41 = (this->rhat).super_Vector<double,_3U>.data_[0];
      dVar12 = (this->rhat).super_Vector<double,_3U>.data_[1];
      dVar13 = (this->rhat).super_Vector<double,_3U>.data_[2];
      dVar43 = (this->Qar).super_Vector<double,_3U>.data_[1];
      dVar44 = (this->Qar).super_Vector<double,_3U>.data_[2];
      local_138[0] = dVar44 * dVar12 - dVar13 * dVar43;
      local_138[1] = dVar4 * dVar13 - dVar41 * dVar44;
      local_138[2] = dVar41 * dVar43 - dVar4 * dVar12;
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] * dVar45;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar5;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = (this->QaxQb).super_Vector<double,_3U>.data_[lVar30] * 4.0;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Tb).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar41 = (this->rhat).super_Vector<double,_3U>.data_[1];
      dVar5 = (this->rhat).super_Vector<double,_3U>.data_[2];
      dVar38 = (this->rhat).super_Vector<double,_3U>.data_[0];
      dVar4 = (this->rQb).super_Vector<double,_3U>.data_[0];
      dVar12 = (this->rQb).super_Vector<double,_3U>.data_[1];
      dVar13 = (this->rQb).super_Vector<double,_3U>.data_[2];
      local_d8[0] = dVar12 * dVar5 - dVar13 * dVar41;
      local_d8[1] = dVar13 * dVar38 - dVar4 * dVar5;
      local_d8[2] = dVar4 * dVar41 - dVar38 * dVar12;
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar30 = 0;
      do {
        local_118[lVar30] = local_d8[lVar30] * dVar39 * -2.0;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar4 = (this->rQaQb).super_Vector<double,_3U>.data_[0];
      dVar39 = (this->rQaQb).super_Vector<double,_3U>.data_[1];
      dVar12 = (this->rQaQb).super_Vector<double,_3U>.data_[2];
      local_b8[0] = dVar5 * dVar39 - dVar41 * dVar12;
      local_b8[1] = dVar38 * dVar12 - dVar5 * dVar4;
      local_b8[2] = dVar41 * dVar4 - dVar38 * dVar39;
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      lVar30 = 0;
      do {
        local_f8[lVar30] = local_b8[lVar30] * 4.0;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar30 = 0;
      do {
        local_138[lVar30] = local_118[lVar30] - local_f8[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_98[0] = 0.0;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      lVar30 = 0;
      do {
        local_98[lVar30] = (this->rQaxQbr).super_Vector<double,_3U>.data_[lVar30] * 4.0;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] + local_98[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar42;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Tb).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      dVar26 = (this->rhat).super_Vector<double,_3U>.data_[0];
      dVar38 = (this->rhat).super_Vector<double,_3U>.data_[1];
      dVar4 = (this->rhat).super_Vector<double,_3U>.data_[2];
      local_138[0] = dStack_70 * dVar38 - local_78 * dVar4;
      local_138[1] = local_48 * dVar4 - dStack_70 * dVar26;
      local_138[2] = local_78 * dVar26 - local_48 * dVar38;
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30] = local_138[lVar30] * dVar45;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      lVar30 = 0;
      do {
        local_1c8[lVar30] = local_1a8[lVar30] * dVar6;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = local_1c8[lVar30] * dVar40;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (this->Tb).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
    }
  }
  if (idat->doElectricField == true) {
    dVar26 = idat->electroMult;
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    do {
      local_1a8[lVar30 + 4] = (this->Ea).super_Vector<double,_3U>.data_[lVar30] * dVar26;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    lVar30 = 0;
    do {
      (idat->eField1).super_Vector<double,_3U>.data_[lVar30] =
           local_1a8[lVar30 + 4] + (idat->eField1).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    do {
      local_1a8[lVar30 + 4] = (this->Eb).super_Vector<double,_3U>.data_[lVar30] * dVar26;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    lVar30 = 0;
    do {
      (idat->eField2).super_Vector<double,_3U>.data_[lVar30] =
           local_1a8[lVar30 + 4] + (idat->eField2).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
  }
  if (idat->doSitePotential == true) {
    dVar26 = idat->electroMult * this->Pa + idat->sPot1;
    dVar38 = idat->electroMult * this->Pb + idat->sPot2;
    auVar11._8_4_ = SUB84(dVar38,0);
    auVar11._0_8_ = dVar26;
    auVar11._12_4_ = (int)((ulong)dVar38 >> 0x20);
    idat->sPot1 = dVar26;
    idat->sPot2 = (RealType)auVar11._8_8_;
  }
  if (this->a_is_Fluctuating == true) {
    idat->dVdFQ1 = this->dUdCa * idat->sw + idat->dVdFQ1;
  }
  if (this->b_is_Fluctuating == true) {
    idat->dVdFQ2 = this->dUdCb * idat->sw + idat->dVdFQ2;
  }
  if (idat->excluded == false) {
    dVar26 = *__s;
    idat->vpair = idat->vpair + dVar26;
    dVar38 = idat->sw;
    (idat->pot).data_[2] = dVar26 * dVar38 + (idat->pot).data_[2];
    if (idat->isSelected == true) {
      (idat->selePot).data_[2] = *__s * dVar38 + (idat->selePot).data_[2];
    }
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    do {
      local_1a8[lVar30 + 4] = (this->F).super_Vector<double,_3U>.data_[lVar30] * dVar38;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    lVar30 = 0;
    do {
      (idat->f1).super_Vector<double,_3U>.data_[lVar30] =
           local_1a8[lVar30 + 4] + (idat->f1).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    if ((this->a_is_Dipole != false) || (this->a_is_Quadrupole == true)) {
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = (this->Ta).super_Vector<double,_3U>.data_[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (idat->t1).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (idat->t1).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
    }
    if ((this->b_is_Dipole != false) || (this->b_is_Quadrupole == true)) {
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = (this->Tb).super_Vector<double,_3U>.data_[lVar30] * dVar38;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (idat->t2).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (idat->t2).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
    }
  }
  else {
    idat->vpair = idat->vpair + this->indirect_Pot;
    (idat->excludedPot).data_[2] = this->excluded_Pot + (idat->excludedPot).data_[2];
    dVar26 = idat->sw;
    (idat->pot).data_[2] = this->indirect_Pot * dVar26 + (idat->pot).data_[2];
    if (idat->isSelected == true) {
      (idat->selePot).data_[2] = this->indirect_Pot * dVar26 + (idat->selePot).data_[2];
    }
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar30 = 0;
    do {
      local_1a8[lVar30 + 4] = (this->indirect_F).super_Vector<double,_3U>.data_[lVar30] * dVar26;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    lVar30 = 0;
    do {
      (idat->f1).super_Vector<double,_3U>.data_[lVar30] =
           local_1a8[lVar30 + 4] + (idat->f1).super_Vector<double,_3U>.data_[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 3);
    if ((this->a_is_Dipole != false) || (this->a_is_Quadrupole == true)) {
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = (this->indirect_Ta).super_Vector<double,_3U>.data_[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (idat->t1).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (idat->t1).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
    }
    if ((this->b_is_Dipole != false) || (this->b_is_Quadrupole == true)) {
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar30 = 0;
      do {
        local_1a8[lVar30 + 4] = (this->indirect_Tb).super_Vector<double,_3U>.data_[lVar30] * dVar26;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      lVar30 = 0;
      do {
        (idat->t2).super_Vector<double,_3U>.data_[lVar30] =
             local_1a8[lVar30 + 4] + (idat->t2).super_Vector<double,_3U>.data_[lVar30];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
    }
  }
  return;
}

Assistant:

void Electrostatic::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    if (Etids[idat.atid1] != -1) {
      data1              = ElectrostaticMap[Etids[idat.atid1]];
      a_is_Charge        = data1.is_Charge;
      a_is_Dipole        = data1.is_Dipole;
      a_is_Quadrupole    = data1.is_Quadrupole;
      a_is_Fluctuating   = data1.is_Fluctuating;
      a_uses_SlaterIntra = data1.uses_SlaterIntramolecular;

    } else {
      a_is_Charge        = false;
      a_is_Dipole        = false;
      a_is_Quadrupole    = false;
      a_is_Fluctuating   = false;
      a_uses_SlaterIntra = false;
    }
    if (Etids[idat.atid2] != -1) {
      data2              = ElectrostaticMap[Etids[idat.atid2]];
      b_is_Charge        = data2.is_Charge;
      b_is_Dipole        = data2.is_Dipole;
      b_is_Quadrupole    = data2.is_Quadrupole;
      b_is_Fluctuating   = data2.is_Fluctuating;
      b_uses_SlaterIntra = data2.uses_SlaterIntramolecular;

    } else {
      b_is_Charge        = false;
      b_is_Dipole        = false;
      b_is_Quadrupole    = false;
      b_is_Fluctuating   = false;
      b_uses_SlaterIntra = false;
    }

    U = 0.0;      // Potential
    F.zero();     // Force
    Ta.zero();    // Torque on site a
    Tb.zero();    // Torque on site b
    Ea.zero();    // Electric field at site a
    Eb.zero();    // Electric field at site b
    Pa    = 0.0;  // Site potential at site a
    Pb    = 0.0;  // Site potential at site b
    dUdCa = 0.0;  // fluctuating charge force at site a
    dUdCb = 0.0;  // fluctuating charge force at site a

    // Indirect interactions mediated by the reaction field.
    indirect_Pot = 0.0;  // Potential
    indirect_F.zero();   // Force
    indirect_Ta.zero();  // Torque on site a
    indirect_Tb.zero();  // Torque on site b

    // Excluded potential that is still computed for fluctuating charges
    excluded_Pot = 0.0;

    // some variables we'll need independent of electrostatic type:

    ri   = 1.0 / idat.rij;
    rhat = idat.d * ri;

    // Obtain all of the required radial function values from the
    // spline structures:

    if (((a_uses_SlaterIntra || b_uses_SlaterIntra) && idat.excluded)) {
      J = Jij[FQtids[idat.atid1]][FQtids[idat.atid2]];
    }

    // needed for fields (and forces):
    if (a_is_Charge || b_is_Charge) {
      v01s->getValueAndDerivativeAt(idat.rij, v01, dv01);
    }
    if (a_is_Dipole || b_is_Dipole) {
      v11s->getValueAndDerivativeAt(idat.rij, v11, dv11);
      v11or = ri * v11;
    }
    if (a_is_Quadrupole || b_is_Quadrupole || (a_is_Dipole && b_is_Dipole)) {
      v21s->getValueAndDerivativeAt(idat.rij, v21, dv21);
      v22s->getValueAndDerivativeAt(idat.rij, v22, dv22);
      v22or = ri * v22;
    }

    // needed for potentials (and forces and torques):
    if ((a_is_Dipole && b_is_Quadrupole) || (b_is_Dipole && a_is_Quadrupole)) {
      v31s->getValueAndDerivativeAt(idat.rij, v31, dv31);
      v32s->getValueAndDerivativeAt(idat.rij, v32, dv32);
      v31or = v31 * ri;
      v32or = v32 * ri;
    }
    if (a_is_Quadrupole && b_is_Quadrupole) {
      v41s->getValueAndDerivativeAt(idat.rij, v41, dv41);
      v42s->getValueAndDerivativeAt(idat.rij, v42, dv42);
      v43s->getValueAndDerivativeAt(idat.rij, v43, dv43);
      v42or = v42 * ri;
      v43or = v43 * ri;
    }

    // calculate the single-site contributions (fields, etc).

    if (a_is_Charge) {
      C_a = data1.fixedCharge;

      if (a_is_Fluctuating) { C_a += idat.flucQ1; }

      if (idat.excluded) {
        idat.skippedCharge2 += C_a;
      } else {
        // only do the field and site potentials if we're not excluded:
        Eb -= C_a * pre11_ * dv01 * rhat;
        Pb += C_a * pre11_ * v01;
      }
    }

    if (a_is_Dipole) {
      rdDa = dot(rhat, idat.D_1);
      rxDa = cross(rhat, idat.D_1);
      if (!idat.excluded) {
        Eb -= pre12_ * ((dv11 - v11or) * rdDa * rhat + v11or * idat.D_1);
        Pb += pre12_ * v11 * rdDa;
      }
    }

    if (a_is_Quadrupole) {
      trQa  = idat.Q_1.trace();
      Qar   = idat.Q_1 * rhat;
      rQa   = rhat * idat.Q_1;
      rdQar = dot(rhat, Qar);
      rxQar = cross(rhat, Qar);
      if (!idat.excluded) {
        Eb -= pre14_ * (trQa * rhat * dv21 + 2.0 * Qar * v22or +
                        rdQar * rhat * (dv22 - 2.0 * v22or));
        Pb += pre14_ * (v21 * trQa + v22 * rdQar);
      }
    }

    if (b_is_Charge) {
      C_b = data2.fixedCharge;

      if (b_is_Fluctuating) { C_b += idat.flucQ2; }

      if (idat.excluded) {
        idat.skippedCharge1 += C_b;
      } else {
        // only do the field if we're not excluded:
        Ea += C_b * pre11_ * dv01 * rhat;
        Pa += C_b * pre11_ * v01;
      }
    }

    if (b_is_Dipole) {
      rdDb = dot(rhat, idat.D_2);
      rxDb = cross(rhat, idat.D_2);
      if (!idat.excluded) {
        Ea += pre12_ * ((dv11 - v11or) * rdDb * rhat + v11or * idat.D_2);
        Pa += pre12_ * v11 * rdDb;
      }
    }

    if (b_is_Quadrupole) {
      trQb  = idat.Q_2.trace();
      Qbr   = idat.Q_2 * rhat;
      rQb   = rhat * idat.Q_2;
      rdQbr = dot(rhat, Qbr);
      rxQbr = cross(rhat, Qbr);
      if (!idat.excluded) {
        Ea += pre14_ * (trQb * rhat * dv21 + 2.0 * Qbr * v22or +
                        rdQbr * rhat * (dv22 - 2.0 * v22or));
        Pa += pre14_ * (v21 * trQb + v22 * rdQbr);
      }
    }

    if (a_is_Charge) {
      if (b_is_Charge) {
        pref = pre11_ * idat.electroMult;
        U += C_a * C_b * pref * v01;
        F += C_a * C_b * pref * dv01 * rhat;

        // If this is an excluded pair, there are still indirect
        // interactions via the reaction field we must worry about:

        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = preRF_ * pref * C_a * C_b * idat.r2;
          indirect_Pot += rfContrib;
          indirect_F += rfContrib * 2.0 * ri * rhat;
        }

        // Fluctuating charge forces are handled via Coulomb integrals
        // for excluded pairs (i.e. those connected via bonds) and
        // with the standard charge-charge interaction otherwise.

        if (idat.excluded) {
          if (a_uses_SlaterIntra || b_uses_SlaterIntra) {
            coulInt = J->getValueAt(idat.rij);
            excluded_Pot += C_a * C_b * coulInt;
            if (a_is_Fluctuating) dUdCa += C_b * coulInt;
            if (b_is_Fluctuating) dUdCb += C_a * coulInt;
          }
        } else {
          if (a_is_Fluctuating) dUdCa += C_b * pref * v01;
          if (b_is_Fluctuating) dUdCb += C_a * pref * v01;
        }
      }

      if (b_is_Dipole) {
        pref = pre12_ * idat.electroMult;
        U += C_a * pref * v11 * rdDb;
        F += C_a * pref * ((dv11 - v11or) * rdDb * rhat + v11or * idat.D_2);
        Tb += C_a * pref * v11 * rxDb;

        if (a_is_Fluctuating) dUdCa += pref * v11 * rdDb;

        // Even if we excluded this pair from direct interactions, we
        // still have the reaction-field-mediated charge-dipole
        // interaction:

        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = C_a * pref * preRF_ * 2.0 * idat.rij;
          indirect_Pot += rfContrib * rdDb;
          indirect_F += rfContrib * idat.D_2 / idat.rij;
          indirect_Tb += C_a * pref * preRF_ * rxDb;
        }
      }

      if (b_is_Quadrupole) {
        pref = pre14_ * idat.electroMult;
        U += C_a * pref * (v21 * trQb + v22 * rdQbr);
        F += C_a * pref * (trQb * dv21 * rhat + 2.0 * Qbr * v22or);
        F += C_a * pref * rdQbr * rhat * (dv22 - 2.0 * v22or);
        Tb += C_a * pref * 2.0 * rxQbr * v22;

        if (a_is_Fluctuating) dUdCa += pref * (v21 * trQb + v22 * rdQbr);
      }
    }

    if (a_is_Dipole) {
      if (b_is_Charge) {
        pref = pre12_ * idat.electroMult;

        U -= C_b * pref * v11 * rdDa;
        F -= C_b * pref * ((dv11 - v11or) * rdDa * rhat + v11or * idat.D_1);
        Ta -= C_b * pref * v11 * rxDa;

        if (b_is_Fluctuating) dUdCb -= pref * v11 * rdDa;

        // Even if we excluded this pair from direct interactions,
        // we still have the reaction-field-mediated charge-dipole
        // interaction:
        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = C_b * pref * preRF_ * 2.0 * idat.rij;
          indirect_Pot -= rfContrib * rdDa;
          indirect_F -= rfContrib * idat.D_1 / idat.rij;
          indirect_Ta -= C_b * pref * preRF_ * rxDa;
        }
      }

      if (b_is_Dipole) {
        pref  = pre22_ * idat.electroMult;
        DadDb = dot(idat.D_1, idat.D_2);
        DaxDb = cross(idat.D_1, idat.D_2);

        U -= pref * (DadDb * v21 + rdDa * rdDb * v22);
        F -= pref * (dv21 * DadDb * rhat +
                     v22or * (rdDb * idat.D_1 + rdDa * idat.D_2));
        F -= pref * (rdDa * rdDb) * (dv22 - 2.0 * v22or) * rhat;
        Ta += pref * (v21 * DaxDb - v22 * rdDb * rxDa);
        Tb += pref * (-v21 * DaxDb - v22 * rdDa * rxDb);
        // Even if we excluded this pair from direct interactions, we
        // still have the reaction-field-mediated dipole-dipole
        // interaction:
        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = -pref * preRF_ * 2.0;
          indirect_Pot += rfContrib * DadDb;
          indirect_Ta += rfContrib * DaxDb;
          indirect_Tb -= rfContrib * DaxDb;
        }
      }

      if (b_is_Quadrupole) {
        pref   = pre24_ * idat.electroMult;
        DadQb  = idat.D_1 * idat.Q_2;
        DadQbr = dot(idat.D_1, Qbr);
        DaxQbr = cross(idat.D_1, Qbr);

        U -= pref * ((trQb * rdDa + 2.0 * DadQbr) * v31 + rdDa * rdQbr * v32);
        F -= pref * (trQb * idat.D_1 + 2.0 * DadQb) * v31or;
        F -= pref * (trQb * rdDa + 2.0 * DadQbr) * (dv31 - v31or) * rhat;
        F -= pref * (idat.D_1 * rdQbr + 2.0 * rdDa * rQb) * v32or;
        F -= pref * (rdDa * rdQbr * rhat * (dv32 - 3.0 * v32or));
        Ta += pref * ((-trQb * rxDa + 2.0 * DaxQbr) * v31 - rxDa * rdQbr * v32);
        Tb += pref * ((2.0 * cross(DadQb, rhat) - 2.0 * DaxQbr) * v31 -
                      2.0 * rdDa * rxQbr * v32);
      }
    }

    if (a_is_Quadrupole) {
      if (b_is_Charge) {
        pref = pre14_ * idat.electroMult;
        U += C_b * pref * (v21 * trQa + v22 * rdQar);
        F += C_b * pref * (trQa * rhat * dv21 + 2.0 * Qar * v22or);
        F += C_b * pref * rdQar * rhat * (dv22 - 2.0 * v22or);
        Ta += C_b * pref * 2.0 * rxQar * v22;

        if (b_is_Fluctuating) dUdCb += pref * (v21 * trQa + v22 * rdQar);
      }
      if (b_is_Dipole) {
        pref   = pre24_ * idat.electroMult;
        DbdQa  = idat.D_2 * idat.Q_1;
        DbdQar = dot(idat.D_2, Qar);
        DbxQar = cross(idat.D_2, Qar);

        U += pref * ((trQa * rdDb + 2.0 * DbdQar) * v31 + rdDb * rdQar * v32);
        F += pref * (trQa * idat.D_2 + 2.0 * DbdQa) * v31or;
        F += pref * (trQa * rdDb + 2.0 * DbdQar) * (dv31 - v31or) * rhat;
        F += pref * (idat.D_2 * rdQar + 2.0 * rdDb * rQa) * v32or;
        F += pref * (rdDb * rdQar * rhat * (dv32 - 3.0 * v32or));
        Ta += pref * ((-2.0 * cross(DbdQa, rhat) + 2.0 * DbxQar) * v31 +
                      2.0 * rdDb * rxQar * v32);
        Tb += pref * ((trQa * rxDb - 2.0 * DbxQar) * v31 + rxDb * rdQar * v32);
      }
      if (b_is_Quadrupole) {
        pref    = pre44_ * idat.electroMult;  // yes
        QaQb    = idat.Q_1 * idat.Q_2;
        trQaQb  = QaQb.trace();
        rQaQb   = rhat * QaQb;
        QaQbr   = QaQb * rhat;
        QaxQb   = mCross(idat.Q_1, idat.Q_2);
        rQaQbr  = dot(rQa, Qbr);
        rQaxQbr = cross(rQa, Qbr);

        U += pref * (trQa * trQb + 2.0 * trQaQb) * v41;
        U += pref * (trQa * rdQbr + trQb * rdQar + 4.0 * rQaQbr) * v42;
        U += pref * (rdQar * rdQbr) * v43;

        F += pref * rhat * (trQa * trQb + 2.0 * trQaQb) * dv41;
        F += pref * rhat * (trQa * rdQbr + trQb * rdQar + 4.0 * rQaQbr) *
             (dv42 - 2.0 * v42or);
        F += pref * rhat * (rdQar * rdQbr) * (dv43 - 4.0 * v43or);

        F += pref * 2.0 * (trQb * rQa + trQa * rQb) * v42or;
        F += pref * 4.0 * (rQaQb + QaQbr) * v42or;
        F += pref * 2.0 * (rQa * rdQbr + rdQar * rQb) * v43or;

        Ta += pref * (-4.0 * QaxQb * v41);
        Ta += pref *
              (-2.0 * trQb * cross(rQa, rhat) + 4.0 * cross(rhat, QaQbr) -
               4.0 * rQaxQbr) *
              v42;
        Ta += pref * 2.0 * cross(rhat, Qar) * rdQbr * v43;

        Tb += pref * (+4.0 * QaxQb * v41);
        Tb += pref *
              (-2.0 * trQa * cross(rQb, rhat) - 4.0 * cross(rQaQb, rhat) +
               4.0 * rQaxQbr) *
              v42;
        // Possible replacement for line 2 above:
        //             + 4.0 * cross(rhat, QbQar)

        Tb += pref * 2.0 * cross(rhat, Qbr) * rdQar * v43;
      }
    }

    if (idat.doElectricField) {
      idat.eField1 += Ea * idat.electroMult;
      idat.eField2 += Eb * idat.electroMult;
    }

    if (idat.doSitePotential) {
      idat.sPot1 += Pa * idat.electroMult;
      idat.sPot2 += Pb * idat.electroMult;
    }

    if (a_is_Fluctuating) idat.dVdFQ1 += dUdCa * idat.sw;
    if (b_is_Fluctuating) idat.dVdFQ2 += dUdCb * idat.sw;

    if (!idat.excluded) {
      idat.vpair += U;
      idat.pot[ELECTROSTATIC_FAMILY] += U * idat.sw;
      if (idat.isSelected) idat.selePot[ELECTROSTATIC_FAMILY] += U * idat.sw;

      idat.f1 += F * idat.sw;

      if (a_is_Dipole || a_is_Quadrupole) idat.t1 += Ta * idat.sw;

      if (b_is_Dipole || b_is_Quadrupole) idat.t2 += Tb * idat.sw;

    } else {
      // only accumulate the forces and torques resulting from the
      // indirect reaction field terms.

      idat.vpair += indirect_Pot;
      idat.excludedPot[ELECTROSTATIC_FAMILY] += excluded_Pot;
      idat.pot[ELECTROSTATIC_FAMILY] += idat.sw * indirect_Pot;
      if (idat.isSelected)
        idat.selePot[ELECTROSTATIC_FAMILY] += idat.sw * indirect_Pot;

      idat.f1 += idat.sw * indirect_F;

      if (a_is_Dipole || a_is_Quadrupole) idat.t1 += idat.sw * indirect_Ta;

      if (b_is_Dipole || b_is_Quadrupole) idat.t2 += idat.sw * indirect_Tb;
    }
    return;
  }